

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

int __thiscall QString::remove(QString *this,char *__filename)

{
  initializer_list<QtPrivate::QPodArrayOps<char16_t>::Span> ranges;
  bool bVar1;
  qsizetype qVar2;
  QString *pQVar3;
  longlong *plVar4;
  char16_t *pcVar5;
  char16_t *pcVar6;
  long in_RDX;
  long in_FS_OFFSET;
  char16_t *toRemove_start;
  char16_t *begin;
  qsizetype sz;
  QString copy;
  QString *in_stack_ffffffffffffff18;
  QArrayDataPointer<char16_t> *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff38;
  Initialization IVar7;
  QPodArrayOps<char16_t> *in_stack_ffffffffffffff40;
  QString *this_00;
  char16_t *in_stack_ffffffffffffff58;
  QPodArrayOps<char16_t> *in_stack_ffffffffffffff60;
  QString *local_70;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  long local_30;
  char16_t *local_28;
  char16_t *local_20;
  char16_t *local_18;
  char16_t *local_10;
  long local_8;
  
  IVar7 = (Initialization)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_70 = (QString *)__filename;
  local_30 = in_RDX;
  if ((long)__filename < 0) {
    qVar2 = size(this);
    local_70 = (QString *)(__filename + qVar2);
  }
  this_00 = local_70;
  pQVar3 = (QString *)size(this);
  if ((this_00 < pQVar3) && (0 < local_30)) {
    qVar2 = size(this);
    local_38 = qVar2 - (long)local_70;
    plVar4 = std::min<long_long>(&local_30,&local_38);
    local_30 = *plVar4;
    QArrayDataPointer<char16_t>::operator->(&this->d);
    bVar1 = QArrayDataPointer<char16_t>::isShared(in_stack_ffffffffffffff20);
    if (bVar1) {
      size(this);
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QString(this_00,(qsizetype)in_stack_ffffffffffffff40,IVar7);
      pcVar5 = QArrayDataPointer<char16_t>::begin((QArrayDataPointer<char16_t> *)0x50abea);
      pcVar6 = QArrayDataPointer<char16_t>::begin((QArrayDataPointer<char16_t> *)0x50abf9);
      QArrayDataPointer<char16_t>::operator->(&local_58);
      local_18 = pcVar6 + (long)local_70 + local_30;
      local_28 = pcVar5;
      local_20 = pcVar6 + (long)local_70;
      local_10 = QArrayDataPointer<char16_t>::end(in_stack_ffffffffffffff20);
      ranges._M_len = (size_type)in_stack_ffffffffffffff58;
      ranges._M_array = (iterator)this;
      QtPrivate::QPodArrayOps<char16_t>::copyRanges(in_stack_ffffffffffffff40,ranges);
      swap((QString *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      ~QString((QString *)0x50aca6);
    }
    else {
      QArrayDataPointer<char16_t>::operator->(&this->d);
      QArrayDataPointer<char16_t>::begin((QArrayDataPointer<char16_t> *)0x50ab4e);
      QtPrivate::QPodArrayOps<char16_t>::erase
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(qsizetype)this);
      pcVar5 = QArrayDataPointer<char16_t>::data(&this->d);
      pcVar5[(this->d).size] = L'\0';
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (int)this;
}

Assistant:

QString &QString::remove(qsizetype pos, qsizetype len)
{
    if (pos < 0)  // count from end of string
        pos += size();

    if (size_t(pos) >= size_t(size()) || len <= 0)
        return *this;

    len = std::min(len, size() - pos);

    if (!d->isShared()) {
        d->erase(d.begin() + pos, len);
        d.data()[d.size] = u'\0';
    } else {
        // TODO: either reserve "size()", which is bigger than needed, or
        // modify the shrinking-erase docs of this method (since the size
        // of "copy" won't have any extra capacity any more)
        const qsizetype sz = size() - len;
        QString copy{sz, Qt::Uninitialized};
        auto begin = d.begin();
        auto toRemove_start = d.begin() + pos;
        copy.d->copyRanges({{begin, toRemove_start},
                           {toRemove_start + len, d.end()}});
        swap(copy);
    }
    return *this;
}